

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void vrna_init_rand(void)

{
  uint uVar1;
  clock_t cVar2;
  time_t tVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  cVar2 = clock();
  tVar3 = time((time_t *)0x0);
  uVar1 = getpid();
  uVar4 = uVar1 >> 0xd ^ ((int)cVar2 - uVar1) - (int)tVar3;
  uVar5 = uVar4 << 8 ^ ((int)tVar3 - uVar1) - uVar4;
  uVar6 = uVar5 >> 0xd ^ (uVar1 - uVar4) - uVar5;
  uVar1 = uVar6 >> 0xc ^ (uVar4 - uVar5) - uVar6;
  uVar4 = uVar1 << 0x10 ^ (uVar5 - uVar6) - uVar1;
  uVar5 = uVar4 >> 5 ^ (uVar6 - uVar1) - uVar4;
  uVar1 = uVar5 >> 3 ^ (uVar1 - uVar4) - uVar5;
  uVar4 = uVar1 << 10 ^ (uVar4 - uVar5) - uVar1;
  uVar1 = uVar4 >> 0xf ^ uVar5 - (uVar1 + uVar4);
  xsubi[0] = (unsigned_short)uVar1;
  xsubi[1] = (short)(uVar1 >> 6) + xsubi[0];
  xsubi[2] = (short)(uVar1 >> 0xc) + xsubi[0];
  srand(uVar1);
  return;
}

Assistant:

PUBLIC void
vrna_init_rand(void)
{
  uint32_t seed = rj_mix(clock(), time(NULL), getpid());

  xsubi[0]  = xsubi[1] = xsubi[2] = (unsigned short)seed;  /* lower 16 bit */
  xsubi[1]  += (unsigned short)((unsigned)seed >> 6);
  xsubi[2]  += (unsigned short)((unsigned)seed >> 12);
#ifndef HAVE_ERAND48
  srand((unsigned int)seed);
#endif
}